

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O3

qsbr_epoch __thiscall
unodb::qsbr::change_epoch(qsbr *this,qsbr_epoch current_global_epoch,bool single_thread_mode)

{
  bool bVar1;
  type tVar2;
  __int_type_conflict _Var3;
  byte bVar4;
  __int_type_conflict word;
  qsbr_epoch local_2a;
  qsbr_epoch local_29 [8];
  qsbr_epoch current_global_epoch_local;
  
  local_29[0].epoch_val = current_global_epoch.epoch_val;
  epoch_change_barrier_and_handle_orphans(this,single_thread_mode);
  word = (this->state).super___atomic_base<unsigned_long>._M_i;
  if (((uint)word & 0x3fffffff) <= ((uint)(word >> 0x20) & 0x3fffffff)) {
    do {
      bVar1 = detail::qsbr_epoch::operator==(local_29,(qsbr_epoch)(epoch_type)(word >> 0x3e));
      if (!bVar1) {
        __assert_fail("current_global_epoch == qsbr_state::get_epoch(old_state)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                      ,0x1f9,
                      "detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)");
      }
      tVar2 = qsbr_state::inc_epoch_reset_previous(word);
      LOCK();
      _Var3 = (this->state).super___atomic_base<unsigned_long>._M_i;
      bVar1 = word == _Var3;
      if (bVar1) {
        (this->state).super___atomic_base<unsigned_long>._M_i = tVar2;
        _Var3 = word;
      }
      UNLOCK();
      if (bVar1) {
        if (3 < local_29[0].epoch_val) {
          __assert_fail("epoch_val <= max",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                        ,0x9c,"void unodb::detail::qsbr_epoch::assert_invariant() const");
        }
        bVar4 = local_29[0].epoch_val + 1 & 3;
        local_2a.epoch_val = bVar4;
        if (((uint)tVar2 & 0x3fffffff) <= ((uint)(tVar2 >> 0x20) & 0x3fffffff)) {
          bVar1 = detail::qsbr_epoch::operator==(&local_2a,(qsbr_epoch)(epoch_type)(tVar2 >> 0x3e));
          if (!bVar1) {
            __assert_fail("current_global_epoch.advance() == qsbr_state::get_epoch(new_state)",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                          ,0x200,
                          "detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)");
          }
          (this->epoch_change_count).super___atomic_base<unsigned_long>._M_i =
               (this->epoch_change_count).super___atomic_base<unsigned_long>._M_i + 1;
          return (qsbr_epoch)bVar4;
        }
        break;
      }
      word = _Var3;
    } while (((uint)_Var3 & 0x3fffffff) <= ((uint)(_Var3 >> 0x20) & 0x3fffffff));
  }
  __assert_fail("threads_in_previous <= thread_count",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
}

Assistant:

detail::qsbr_epoch qsbr::change_epoch(detail::qsbr_epoch current_global_epoch,
                                      bool single_thread_mode) noexcept {
  epoch_change_barrier_and_handle_orphans(single_thread_mode);

  auto old_state = state.load(std::memory_order_acquire);
  while (true) {
    UNODB_DETAIL_ASSERT(current_global_epoch ==
                        qsbr_state::get_epoch(old_state));

    const auto new_state = qsbr_state::inc_epoch_reset_previous(old_state);
    if (UNODB_DETAIL_LIKELY(state.compare_exchange_weak(
            old_state, new_state, std::memory_order_acq_rel,
            std::memory_order_acquire))) {
      UNODB_DETAIL_ASSERT(current_global_epoch.advance() ==
                          qsbr_state::get_epoch(new_state));

#ifdef UNODB_DETAIL_WITH_STATS
      bump_epoch_change_count();
#endif  // UNODB_DETAIL_WITH_STATS
      return current_global_epoch.advance();
    }

    // Nobody else can change epoch nor threads in the previous epoch, only
    // allowed failures are thread count change and spurious. The next loop
    // iteration will assert this.
  }
}